

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall higan::Buffer::Append(Buffer *this,char *begin,size_t len)

{
  size_t sVar1;
  char *__result;
  size_t len_local;
  char *begin_local;
  Buffer *this_local;
  
  sVar1 = WritableSize(this);
  if (sVar1 < len) {
    CopyExDataToBuffer(this,begin,len);
  }
  else {
    __result = WriteBegin(this);
    std::copy<char_const*,char*>(begin,begin + len,__result);
    AddWriteIndex(this,len);
  }
  return;
}

Assistant:

void Buffer::Append(const char* begin, size_t len)
{
	if (len > WritableSize())
	{
		CopyExDataToBuffer(begin, len);
	}
	else
	{
		std::copy(begin, begin + len, WriteBegin());
		AddWriteIndex(len);
	}
}